

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlopl.cpp
# Opt level: O0

void __thiscall
musicBlock::OPLchangeControl(musicBlock *this,uint channel,uchar controller,int value)

{
  ushort uVar1;
  uint uVar2;
  channelEntry *pcVar3;
  uchar uVar4;
  channelEntry *ch_2;
  channelEntry *ch_1;
  uchar flags;
  channelEntry *ch;
  uint local_20;
  uint id;
  uint i;
  int value_local;
  uchar controller_local;
  uint channel_local;
  musicBlock *this_local;
  
  uVar4 = (uchar)value;
  uVar1 = (ushort)value;
  switch(controller) {
  case '\0':
    OPLprogramChange(this,channel,value);
    break;
  case '\x02':
    (this->driverdata).channelModulation[channel] = uVar4;
    for (local_20 = 0; local_20 < this->io->OPLchannels; local_20 = local_20 + 1) {
      pcVar3 = this->channels + local_20;
      if (pcVar3->channel == channel) {
        uVar4 = pcVar3->flags;
        pcVar3->time = this->MLtime;
        if (value < 0x28) {
          pcVar3->flags = pcVar3->flags & 0xfb;
          if (pcVar3->flags != uVar4) {
            writeModulation(this,local_20,pcVar3->instr,0);
          }
        }
        else {
          pcVar3->flags = pcVar3->flags | 4;
          if (pcVar3->flags != uVar4) {
            writeModulation(this,local_20,pcVar3->instr,1);
          }
        }
      }
    }
    break;
  case '\x03':
    (this->driverdata).channelVolume[channel] = uVar4;
  case '\x05':
    if (controller == '\x05') {
      (this->driverdata).channelExpression[channel] = uVar4;
    }
    for (local_20 = 0; local_20 < this->io->OPLchannels; local_20 = local_20 + 1) {
      pcVar3 = this->channels + local_20;
      if (pcVar3->channel == channel) {
        pcVar3->time = this->MLtime;
        uVar2 = calcVolume(this,(uint)(this->driverdata).channelVolume[channel],
                           (uint)(this->driverdata).channelExpression[channel],pcVar3->volume);
        pcVar3->realvolume = uVar2;
        OPLio::OPLwriteVolume(this->io,local_20,pcVar3->instr,pcVar3->realvolume);
      }
    }
    break;
  case '\x04':
    (this->driverdata).channelPan[channel] = (schar)(value + -0x40);
    for (local_20 = 0; local_20 < this->io->OPLchannels; local_20 = local_20 + 1) {
      pcVar3 = this->channels + local_20;
      if (pcVar3->channel == channel) {
        pcVar3->time = this->MLtime;
        OPLio::OPLwritePan(this->io,local_20,pcVar3->instr,value + -0x40);
      }
    }
    break;
  case '\b':
    (this->driverdata).channelSustain[channel] = uVar4;
    if (value < 0x40) {
      releaseSustain(this,channel);
    }
    break;
  case '\n':
    (this->driverdata).channelRPN[channel] =
         (this->driverdata).channelRPN[channel] & 0x7f | (ushort)(value << 7);
    break;
  case '\v':
    (this->driverdata).channelRPN[channel] = (this->driverdata).channelRPN[channel] & 0x3f80 | uVar1
    ;
    break;
  case '\f':
  case '\r':
    (this->driverdata).channelRPN[channel] = 0x3fff;
    break;
  case '\x0e':
    if ((this->driverdata).channelRPN[channel] == 0) {
      (this->driverdata).channelPitchSens[channel] =
           uVar1 * 100 + (this->driverdata).channelPitchSens[channel] % 100;
    }
    break;
  case '\x0f':
    if ((this->driverdata).channelRPN[channel] == 0) {
      (this->driverdata).channelPitchSens[channel] =
           uVar1 + ((this->driverdata).channelPitchSens[channel] / 100) * 100;
    }
    break;
  case '\x10':
    for (local_20 = 0; local_20 < this->io->OPLchannels; local_20 = local_20 + 1) {
      if (this->channels[local_20].channel == channel) {
        releaseChannel(this,local_20,0);
      }
    }
    break;
  case '\x11':
    for (local_20 = 0; local_20 < this->io->OPLchannels; local_20 = local_20 + 1) {
      if (this->channels[local_20].channel == channel) {
        if ((this->driverdata).channelSustain[channel] < 0x40) {
          releaseChannel(this,local_20,0);
        }
        else {
          this->channels[local_20].flags = this->channels[local_20].flags | 2;
        }
      }
    }
  }
  return;
}

Assistant:

void musicBlock::OPLchangeControl(uint channel, uchar controller, int value)
{
	uint i;
	uint id = channel;

	switch (controller)
	{
	case ctrlPatch:			/* change instrument */
		OPLprogramChange(channel, value);
		break;

	case ctrlModulation:
		driverdata.channelModulation[channel] = value;
		for(i = 0; i < io->OPLchannels; i++)
		{
			struct channelEntry *ch = &channels[i];
			if (ch->channel == id)
			{
				uchar flags = ch->flags;
				ch->time = MLtime;
				if (value >= MOD_MIN)
				{
					ch->flags |= CH_VIBRATO;
					if (ch->flags != flags)
						writeModulation(i, ch->instr, 1);
				} else {
					ch->flags &= ~CH_VIBRATO;
					if (ch->flags != flags)
						writeModulation(i, ch->instr, 0);
				}
			}
		}
		break;

	case ctrlVolume:		/* change volume */
		driverdata.channelVolume[channel] = value;
		/* fall-through */
	case ctrlExpression:	/* change expression */
		if (controller == ctrlExpression)
		{
			driverdata.channelExpression[channel] = value;
		}
		for(i = 0; i < io->OPLchannels; i++)
		{
			struct channelEntry *ch = &channels[i];
			if (ch->channel == id)
			{
				ch->time = MLtime;
				ch->realvolume = calcVolume(driverdata.channelVolume[channel],
					driverdata.channelExpression[channel], ch->volume);
				io->OPLwriteVolume(i, ch->instr, ch->realvolume);
			}
		}
		break;

	case ctrlPan:			/* change pan (balance) */
		driverdata.channelPan[channel] = value -= 64;
		for(i = 0; i < io->OPLchannels; i++)
		{
			struct channelEntry *ch = &channels[i];
			if (ch->channel == id)
			{
				ch->time = MLtime;
				io->OPLwritePan(i, ch->instr, value);
			}
		}
		break;

	case ctrlSustainPedal:		/* change sustain pedal (hold) */
		driverdata.channelSustain[channel] = value;
		if (value < 0x40)
			releaseSustain(channel);
		break;

	case ctrlNotesOff:			/* turn off all notes that are not sustained */
		for (i = 0; i < io->OPLchannels; ++i)
		{
			if (channels[i].channel == id)
			{
				if (driverdata.channelSustain[id] < 0x40)
					releaseChannel(i, 0);
				else
					channels[i].flags |= CH_SUSTAIN;
			}
		}
		break;

	case ctrlSoundsOff:			/* release all notes for this channel */
		for (i = 0; i < io->OPLchannels; ++i)
		{
			if (channels[i].channel == id)
			{
				releaseChannel(i, 0);
			}
		}
		break;

	case ctrlRPNHi:
		driverdata.channelRPN[id] = (driverdata.channelRPN[id] & 0x007F) | (value << 7);
		break;

	case ctrlRPNLo:
		driverdata.channelRPN[id] = (driverdata.channelRPN[id] & 0x3F80) | value;
		break;

	case ctrlNRPNLo:
	case ctrlNRPNHi:
		driverdata.channelRPN[id] = 0x3FFF;
		break;

	case ctrlDataEntryHi:
		if (driverdata.channelRPN[id] == 0)
		{
			driverdata.channelPitchSens[id] = value * 100 + (driverdata.channelPitchSens[id] % 100);
		}
		break;

	case ctrlDataEntryLo:
		if (driverdata.channelRPN[id] == 0)
		{
			driverdata.channelPitchSens[id] = value + (driverdata.channelPitchSens[id] / 100) * 100;
		}
		break;
	}
}